

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O2

HighsInt __thiscall
HighsCliqueTable::shrinkToNeighbourhood
          (HighsCliqueTable *this,vector<int,_std::allocator<int>_> *neighbourhoodInds,
          int64_t *numQueries,CliqueVar v,CliqueVar *q,HighsInt N)

{
  pointer piVar1;
  int iVar2;
  long lVar3;
  
  queryNeighbourhood(this,neighbourhoodInds,numQueries,v,q,N);
  lVar3 = 0;
  while( true ) {
    piVar1 = (neighbourhoodInds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = (int)((ulong)((long)(neighbourhoodInds->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)piVar1) >> 2);
    if (iVar2 <= lVar3) break;
    q[lVar3] = q[piVar1[lVar3]];
    lVar3 = lVar3 + 1;
  }
  return iVar2;
}

Assistant:

HighsInt HighsCliqueTable::shrinkToNeighbourhood(
    std::vector<HighsInt>& neighbourhoodInds, int64_t& numQueries, CliqueVar v,
    CliqueVar* q, HighsInt N) {
  queryNeighbourhood(neighbourhoodInds, numQueries, v, q, N);

  for (HighsInt i = 0; i < (HighsInt)neighbourhoodInds.size(); ++i)
    q[i] = q[neighbourhoodInds[i]];

  return neighbourhoodInds.size();
}